

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

SQInteger __thiscall SQFuncState::GetOuterVariable(SQFuncState *this,SQObject *name)

{
  SQObjectValue SVar1;
  SQUnsignedInteger *pSVar2;
  SQTable *pSVar3;
  SQFuncState *this_00;
  SQLocalVarInfo *pSVar4;
  ulong uVar5;
  ulong uVar6;
  SQUnsignedInteger SVar7;
  bool bVar8;
  SQObjectValue in_RAX;
  SQOuterVar *pSVar9;
  SQInteger SVar10;
  SQObjectValue *pSVar11;
  SQObjectValue SVar12;
  SQUnsignedInteger SVar13;
  SQObjectPtr local_58;
  SQObjectPtr local_48;
  SQOuterVar local_38;
  
  pSVar3 = (SQTable *)(this->_outervalues)._size;
  if (0 < (long)pSVar3) {
    pSVar11 = &(((this->_outervalues)._vals)->_name).super_SQObject._unVal;
    in_RAX.pTable = (SQTable *)0x0;
    do {
      if (pSVar11->pTable == (name->_unVal).pTable) {
        return (SQInteger)in_RAX.pTable;
      }
      in_RAX.pTable =
           (SQTable *)
           ((long)&((in_RAX.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                   _vptr_SQRefCounted + 1);
      pSVar11 = pSVar11 + 5;
    } while (pSVar3 != in_RAX.pTable);
  }
  this_00 = this->_parent;
  if (this_00 == (SQFuncState *)0x0) {
LAB_00120674:
    SVar10 = -1;
  }
  else {
    pSVar4 = (this_00->_vlocals)._vals;
    SVar12 = (SQObjectValue)(this_00->_vlocals)._size;
    do {
      if (SVar12.nInteger < 1) {
        in_RAX.nInteger = 0xffffffffffffffff;
        break;
      }
      SVar1.pTable = (SQTable *)(SVar12.nInteger - 1);
      if ((pSVar4[SVar1.nInteger]._name.super_SQObject._type == OT_STRING) &&
         (pSVar4[SVar1.nInteger]._name.super_SQObject._unVal.pTable == (name->_unVal).pTable)) {
        bVar8 = false;
        in_RAX.pTable = SVar1.pTable;
      }
      else {
        bVar8 = true;
        SVar12.pTable = SVar1.pTable;
      }
    } while (bVar8);
    if (in_RAX.pTable == (SQTable *)0xffffffffffffffff) {
      local_48.super_SQObject._unVal.nInteger = GetOuterVariable(this_00,name);
      if (local_48.super_SQObject._unVal.pTable == (SQTable *)0xffffffffffffffff) goto LAB_00120674;
      local_58.super_SQObject._type = name->_type;
      local_58.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
      if ((local_58.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar2 = &((local_58.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar2 = *pSVar2 + 1;
      }
      local_48.super_SQObject._type = OT_INTEGER;
      SQOuterVar::SQOuterVar(&local_38,&local_58,&local_48,otOUTER);
      uVar5 = (this->_outervalues)._size;
      uVar6 = (this->_outervalues)._allocated;
      if (uVar6 <= uVar5) {
        SVar7 = uVar5 * 2;
        SVar13 = 4;
        if (SVar7 != 0) {
          SVar13 = SVar7;
        }
        pSVar9 = (SQOuterVar *)sq_vm_realloc((this->_outervalues)._vals,uVar6 * 0x28,SVar13 * 0x28);
        (this->_outervalues)._vals = pSVar9;
        (this->_outervalues)._allocated = SVar13;
      }
      SVar7 = (this->_outervalues)._size;
      (this->_outervalues)._size = SVar7 + 1;
      SQOuterVar::SQOuterVar((this->_outervalues)._vals + SVar7,&local_38);
    }
    else {
      pSVar4[in_RAX.nInteger]._end_op = 0xffffffffffffffff;
      this_00->_outers = this_00->_outers + 1;
      local_58.super_SQObject._type = name->_type;
      local_58.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
      if ((local_58.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar2 = &((local_58.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar2 = *pSVar2 + 1;
      }
      local_48.super_SQObject._type = OT_INTEGER;
      local_48.super_SQObject._unVal = in_RAX;
      SQOuterVar::SQOuterVar(&local_38,&local_58,&local_48,otLOCAL);
      uVar5 = (this->_outervalues)._size;
      uVar6 = (this->_outervalues)._allocated;
      if (uVar6 <= uVar5) {
        SVar7 = uVar5 * 2;
        SVar13 = 4;
        if (SVar7 != 0) {
          SVar13 = SVar7;
        }
        pSVar9 = (SQOuterVar *)sq_vm_realloc((this->_outervalues)._vals,uVar6 * 0x28,SVar13 * 0x28);
        (this->_outervalues)._vals = pSVar9;
        (this->_outervalues)._allocated = SVar13;
      }
      SVar7 = (this->_outervalues)._size;
      (this->_outervalues)._size = SVar7 + 1;
      SQOuterVar::SQOuterVar((this->_outervalues)._vals + SVar7,&local_38);
    }
    SQObjectPtr::~SQObjectPtr(&local_38._src);
    SQObjectPtr::~SQObjectPtr(&local_38._name);
    SQObjectPtr::~SQObjectPtr(&local_48);
    SQObjectPtr::~SQObjectPtr(&local_58);
    SVar10 = (this->_outervalues)._size - 1;
  }
  return SVar10;
}

Assistant:

SQInteger SQFuncState::GetOuterVariable(const SQObject &name)
{
    SQInteger outers = _outervalues.size();
    for(SQInteger i = 0; i<outers; i++) {
        if(_string(_outervalues[i]._name) == _string(name))
            return i;
    }
    SQInteger pos=-1;
    if(_parent) {
        pos = _parent->GetLocalVariable(name);
        if(pos == -1) {
            pos = _parent->GetOuterVariable(name);
            if(pos != -1) {
                _outervalues.push_back(SQOuterVar(name,SQObjectPtr(SQInteger(pos)),otOUTER)); //local
                return _outervalues.size() - 1;
            }
        }
        else {
            _parent->MarkLocalAsOuter(pos);
            _outervalues.push_back(SQOuterVar(name,SQObjectPtr(SQInteger(pos)),otLOCAL)); //local
            return _outervalues.size() - 1;


        }
    }
    return -1;
}